

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O3

void __thiscall
Memory::Recycler::AutoSetupRecyclerForNonCollectingMark::~AutoSetupRecyclerForNonCollectingMark
          (AutoSetupRecyclerForNonCollectingMark *this)

{
  ObservableValueObserver<Memory::CollectionState> *pOVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Recycler *pRVar5;
  Recycler *pRVar6;
  CollectionState local_1c;
  
  if (this->m_setupDone == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1f27,"(m_setupDone)","m_setupDone");
    if (!bVar3) goto LAB_007178ef;
    *puVar4 = 0;
  }
  pRVar6 = this->m_recycler;
  if (pRVar6->allowAllocationDuringHeapEnum == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1f28,"(!m_recycler.allowAllocationDuringHeapEnum)",
                       "!m_recycler.allowAllocationDuringHeapEnum");
    if (!bVar3) {
LAB_007178ef:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
    pRVar6 = this->m_recycler;
  }
  memcpy(&pRVar6->collectionStats,&this->m_previousCollectionStats,0x538);
  pRVar6 = this->m_recycler;
  local_1c = this->m_previousCollectionState;
  pOVar1 = (pRVar6->collectionState).observer;
  pRVar5 = pRVar6;
  if ((pOVar1 != (ObservableValueObserver<Memory::CollectionState> *)0x0) &&
     ((pRVar6->collectionState).value != local_1c)) {
    (**pOVar1->_vptr_ObservableValueObserver)(pOVar1,&local_1c,&pRVar6->collectionState);
    pRVar5 = this->m_recycler;
  }
  (pRVar6->collectionState).value = local_1c;
  pRVar5->isHeapEnumInProgress = false;
  pRVar5->isCollectionDisabled = false;
  return;
}

Assistant:

Recycler::AutoSetupRecyclerForNonCollectingMark::~AutoSetupRecyclerForNonCollectingMark()
{
    Assert(m_setupDone);
    Assert(!m_recycler.allowAllocationDuringHeapEnum);
#ifdef RECYCLER_STATS
    m_recycler.collectionStats = m_previousCollectionStats;
#endif
    m_recycler.SetCollectionState(m_previousCollectionState);
    m_recycler.isHeapEnumInProgress = false;
    m_recycler.isCollectionDisabled = false;
}